

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRangeList.cpp
# Opt level: O2

DWARFAddressRangesVector * __thiscall
llvm::DWARFDebugRangeList::getAbsoluteRanges
          (DWARFAddressRangesVector *__return_storage_ptr__,DWARFDebugRangeList *this,
          Optional<llvm::object::SectionedAddress> BaseAddr)

{
  pointer pRVar1;
  bool bVar2;
  SectionedAddress *pSVar3;
  RangeListEntry *RLE;
  pointer this_00;
  value_type local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar1 = (this->Entries).
           super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->Entries).
                 super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pRVar1; this_00 = this_00 + 1
      ) {
    bVar2 = RangeListEntry::isBaseAddressSelectionEntry(this_00,this->AddressSize);
    if (bVar2) {
      BaseAddr.Storage.field_0.value.Address = this_00->EndAddress;
      BaseAddr.Storage.field_0.value.SectionIndex = this_00->SectionIndex;
      if (BaseAddr.Storage.hasVal == false) {
        BaseAddr.Storage.hasVal = true;
      }
    }
    else {
      local_48.LowPC = this_00->StartAddress;
      local_48.HighPC = this_00->EndAddress;
      local_48.SectionIndex = this_00->SectionIndex;
      if (BaseAddr.Storage.hasVal == true) {
        pSVar3 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                           (&BaseAddr.Storage);
        local_48.LowPC = local_48.LowPC + pSVar3->Address;
        pSVar3 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                           (&BaseAddr.Storage);
        local_48.HighPC = local_48.HighPC + pSVar3->Address;
        if (local_48.SectionIndex == 0xffffffffffffffff) {
          pSVar3 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                             (&BaseAddr.Storage);
          local_48.SectionIndex = pSVar3->SectionIndex;
        }
      }
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::push_back
                (__return_storage_ptr__,&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DWARFAddressRangesVector DWARFDebugRangeList::getAbsoluteRanges(
    llvm::Optional<object::SectionedAddress> BaseAddr) const {
  DWARFAddressRangesVector Res;
  for (const RangeListEntry &RLE : Entries) {
    if (RLE.isBaseAddressSelectionEntry(AddressSize)) {
      BaseAddr = {RLE.EndAddress, RLE.SectionIndex};
      continue;
    }

    DWARFAddressRange E;
    E.LowPC = RLE.StartAddress;
    E.HighPC = RLE.EndAddress;
    E.SectionIndex = RLE.SectionIndex;
    // Base address of a range list entry is determined by the closest preceding
    // base address selection entry in the same range list. It defaults to the
    // base address of the compilation unit if there is no such entry.
    if (BaseAddr) {
      E.LowPC += BaseAddr->Address;
      E.HighPC += BaseAddr->Address;
      if (E.SectionIndex == -1ULL)
        E.SectionIndex = BaseAddr->SectionIndex;
    }
    Res.push_back(E);
  }
  return Res;
}